

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

BeliefSet * __thiscall
AlphaVectorPlanning::SampleBeliefs
          (BeliefSet *__return_storage_ptr__,AlphaVectorPlanning *this,Arguments *args)

{
  DecPOMDPDiscreteInterface *pDVar1;
  long lVar2;
  BeliefSet *this_00;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined8 uVar9;
  PlanningUnitDecPOMDPDiscrete *pPVar10;
  JointBeliefInterface *pJVar11;
  ostream *this_01;
  long *plVar12;
  undefined8 *puVar13;
  long lVar14;
  bool bVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  BeliefSet S;
  uint local_d8;
  undefined4 local_d4;
  int local_c4;
  QMDP *local_c0;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> local_b8;
  AlphaVectorPlanning *local_98;
  undefined8 local_90;
  size_t local_88;
  double local_80;
  string local_78;
  int local_54;
  Arguments *local_50;
  BeliefSet *local_48;
  double local_40;
  ulong local_38;
  undefined4 extraout_var_00;
  undefined1 extraout_var_01 [56];
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SampleBeliefs","");
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pPVar10 = this->_m_pu;
  if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar10 = (this->_m_puShared).px;
  }
  iVar17 = args->resetAfter;
  iVar6 = (int)(pPVar10->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  local_48 = __return_storage_ptr__;
  local_88 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar10->super_PlanningUnitMADPDiscrete);
  pPVar10 = this->_m_pu;
  if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar10 = (this->_m_puShared).px;
  }
  local_90 = (**(code **)((long)*(pPVar10->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar10 = this->_m_pu;
  if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar10 = (this->_m_puShared).px;
  }
  lVar14 = (long)(int)local_88;
  iVar5 = (*(pPVar10->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar10,lVar14);
  plVar12 = (long *)CONCAT44(extraout_var,iVar5);
  pPVar10 = this->_m_pu;
  if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar10 = (this->_m_puShared).px;
  }
  iVar5 = (*(pPVar10->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar10,lVar14);
  plVar8 = (long *)CONCAT44(extraout_var_00,iVar5);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (&local_b8,(long)args->nrBeliefs,(allocator_type *)&local_78);
  if ((iVar17 == 0) && (iVar17 = iVar6, iVar6 == 999999)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: sampling beliefs for an infinite horizon ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"without reset.",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  if (args->useQMDPforSamplingBeliefs == 0) {
    local_c0 = (QMDP *)0x0;
  }
  else {
    local_c0 = (QMDP *)operator_new(0x70);
    pPVar10 = this->_m_pu;
    if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar10 = (this->_m_puShared).px;
    }
    QMDP::QMDP(local_c0,pPVar10,false);
    (**(code **)(*(long *)local_c0 + 0x10))(local_c0);
  }
  local_54 = iVar17;
  if (iVar6 < iVar17) {
    local_54 = iVar6;
  }
  local_40 = (double)(int)local_90;
  local_d4 = 0;
  iVar17 = 0;
  local_d8 = 0;
  local_c4 = 0;
  local_98 = this;
  local_50 = args;
  do {
    if ((args->nrBeliefs <= (int)local_d8) || (args->nrBeliefs * 2 <= local_c4)) {
      if (plVar12 != (long *)0x0) {
        (**(code **)(*plVar12 + 8))();
      }
      this_00 = local_48;
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
      if (local_c0 != (QMDP *)0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SampleBeliefs","");
      TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((int)local_d8 < args->nrBeliefs) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"AlphaVectorPlanning::SampleBeliefs: warning, only ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"managed to sample ",0x12);
        this_01 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (this_01," unique beliefs instead of ",0x1b);
        plVar12 = (long *)std::ostream::operator<<((ostream *)this_01,args->nrBeliefs);
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        std::ostream::flush();
        std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
                  (this_00,(long)(int)local_d8,(allocator_type *)&local_78);
        if (local_d8 != 0) {
          uVar16 = 0;
          do {
            (this_00->
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar16] =
                 local_b8.
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16];
            uVar16 = uVar16 + 1;
          } while (local_d8 != uVar16);
        }
      }
      else {
        (this_00->
        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)._M_impl
        .super__Vector_impl_data._M_start =
             local_b8.
             super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this_00->
        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)._M_impl
        .super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this_00->
        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             local_b8.
             super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b8.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      if (local_b8.
          super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return this_00;
    }
    if (local_54 < iVar17) {
      iVar17 = 0;
    }
    if (iVar17 == 0) {
      pPVar10 = this->_m_pu;
      if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar10 = (this->_m_puShared).px;
      }
      pDVar1 = pPVar10->_m_DecPOMDP;
      local_d4 = (**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                       *(long *)(*(long *)pDVar1 + -0xb8)) + 0x160))
                           ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8));
      pPVar10 = this->_m_pu;
      if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar10 = (this->_m_puShared).px;
      }
      lVar14 = *(long *)(*plVar8 + -0xb8);
      uVar9 = (**(code **)((long)*(pPVar10->super_PlanningUnitMADPDiscrete)._m_madp + 0x50))();
      (**(code **)(*(long *)((long)plVar8 + lVar14) + 0x28))((long)plVar8 + lVar14,uVar9);
    }
    else {
      if ((args->useQMDPforSamplingBeliefs == 0) ||
         (iVar6 = rand(), (double)iVar6 * 4.656612873077393e-10 <= args->QMDPexploreProb)) {
        iVar6 = rand();
        iVar6 = (int)((double)iVar6 * 4.656612873077393e-10 * local_40);
      }
      else if ((int)local_90 == 0) {
        iVar6 = 0x7fffffff;
      }
      else {
        iVar6 = 0x7fffffff;
        iVar5 = 0;
        auVar22 = ZEXT816(0xffefffffffffffff);
        do {
          local_80 = auVar22._0_8_;
          auVar21._0_8_ = (double)(**(code **)(*(long *)local_c0 + 0x68))(local_c0,plVar12,iVar5);
          auVar21._8_56_ = extraout_var_01;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_80;
          if (local_80 < auVar21._0_8_) {
            iVar6 = iVar5;
          }
          auVar22 = vmaxsd_avx(auVar21._0_16_,auVar22);
          iVar5 = iVar5 + 1;
        } while ((int)local_90 != iVar5);
      }
      this = local_98;
      pPVar10 = local_98->_m_pu;
      if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar10 = (local_98->_m_puShared).px;
      }
      pDVar1 = pPVar10->_m_DecPOMDP;
      uVar7 = (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8))
                          + 0x148))
                        ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),local_d4,
                         iVar6);
      pPVar10 = this->_m_pu;
      if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar10 = (this->_m_puShared).px;
      }
      pDVar1 = pPVar10->_m_DecPOMDP;
      lVar14 = (long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8);
      lVar2 = *(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8));
      if ((pPVar10->super_PlanningUnitMADPDiscrete)._m_params._m_eventObservability == true) {
        (**(code **)(lVar2 + 0x158))(lVar14,local_d4,iVar6,uVar7);
      }
      else {
        (**(code **)(lVar2 + 0x150))(lVar14,iVar6,uVar7);
      }
      (**(code **)(*plVar8 + 0xa8))(plVar8,plVar12);
      pPVar10 = this->_m_pu;
      if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar10 = (this->_m_puShared).px;
      }
      (**(code **)(*plVar8 + 0xb0))
                (plVar8,(long)&pPVar10->_m_DecPOMDP->field_0x0 +
                        *(long *)(*(long *)pPVar10->_m_DecPOMDP + -0xb8),iVar6);
      local_d4 = uVar7;
    }
    bVar15 = true;
    if ((args->uniqueBeliefs != 0) && (bVar18 = local_d8 == 0, !bVar18)) {
      local_38 = (ulong)local_d8;
      uVar16 = 0;
      bVar19 = bVar18;
      do {
        bVar3 = bVar18;
        if ((int)local_88 == 0) {
LAB_003a29d0:
          bVar15 = bVar3;
          local_c4 = local_c4 + ((byte)~bVar15 & 1);
          args = local_50;
          this = local_98;
          break;
        }
        iVar6 = 0;
        while( true ) {
          pJVar11 = local_b8.
                    super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16];
          local_80 = (double)(**(code **)(*(long *)((long)&pJVar11->field_0x0 +
                                                   *(long *)((long)*pJVar11 + -0xb8)) + 0x48))
                                       ((long)&pJVar11->field_0x0 +
                                        *(long *)((long)*pJVar11 + -0xb8),iVar6);
          dVar20 = (double)(**(code **)(*(long *)((long)plVar8 + *(long *)(*plVar8 + -0xb8)) + 0x48)
                           )((long)plVar8 + *(long *)(*plVar8 + -0xb8),iVar6);
          if ((local_80 != dVar20) || (NAN(local_80) || NAN(dVar20))) break;
          iVar6 = iVar6 + 1;
          bVar3 = bVar19;
          if ((int)local_88 == iVar6) goto LAB_003a29d0;
        }
        uVar16 = uVar16 + 1;
        bVar19 = uVar16 == local_38;
        args = local_50;
        this = local_98;
      } while (!bVar19);
    }
    if (bVar15) {
      cVar4 = (**(code **)(*(long *)((long)plVar8 + *(long *)(*plVar8 + -0xb8)) + 0x78))
                        ((long)plVar8 + *(long *)(*plVar8 + -0xb8));
      if (cVar4 == '\0') {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar13 = &PTR__E_0059bd80;
        puVar13[1] = puVar13 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar13 + 1),
                   "AlphaVectorPlanning::BeliefSampling belief fails sanity check","");
        __cxa_throw(puVar13,&E::typeinfo,E::~E);
      }
      pJVar11 = (JointBeliefInterface *)(**(code **)(*plVar8 + 0xb8))(plVar8);
      local_b8.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
      _M_impl.super__Vector_impl_data._M_start[(int)local_d8] = pJVar11;
      local_d8 = local_d8 + 1;
    }
    iVar17 = iVar17 + 1;
    (**(code **)(*plVar12 + 0xa8))(plVar12,plVar8);
  } while( true );
}

Assistant:

BeliefSet AlphaVectorPlanning::SampleBeliefs(
    const ArgumentHandlers::Arguments &args) const
{
    StartTimer("SampleBeliefs");
    
    int resetAfter=args.resetAfter;
    int h=GetPU()->GetHorizon(),
        nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        i,d=0,s;
    Index a;
    Index o;
    Index s0=0,s1;
    JointBeliefInterface *b0p, *b1p;
    b0p = GetPU()->GetNewJointBeliefInterface(nrS);
    b1p = GetPU()->GetNewJointBeliefInterface(nrS);
    JointBeliefInterface& b0 = *b0p;
    JointBeliefInterface& b1 = *b1p;
    BeliefSet S(args.nrBeliefs);
    bool foundEqualBelief,equal,addBelief;
    int nrEqualFound=0;

    // we don't want to artificially reset the problem
    if(resetAfter==0)
    {
        if(h==static_cast<int>(MAXHORIZON))
            cout << "Warning: sampling beliefs for an infinite horizon "
                 << "without reset." << endl;
        resetAfter=h;
    }

    QMDP *qmdp=0;
    if(args.useQMDPforSamplingBeliefs)
    {
        qmdp=new QMDP(GetPU());
        qmdp->Compute();
    }

    i=0;
    // make sure we don't try to keep on sampling beliefs if there are
    // not enough unique beliefs (<args.nrBeliefs)
    while(i<args.nrBeliefs && nrEqualFound<(args.nrBeliefs*2))
    {
        // reset the problem if either we exceeded the horizon, or the
        // user-supplied parameter (used in the infinite-horizon case)
        if(d>h || d>resetAfter)
            d=0;

        if(d==0)
        {
            s1=GetPU()->GetDPOMDPD()->SampleInitialState();
            b1.Set(* GetPU()->GetProblem()->GetISD());
        }
        else
        {
            if(args.useQMDPforSamplingBeliefs &&
               (rand() / (RAND_MAX + 1.0)) > args.QMDPexploreProb)
            {
                double valMax=-DBL_MAX;
                a=INT_MAX;
                for(int aQMDP=0;aQMDP!=nrA;++aQMDP)
                {
                    double qQMDP=qmdp->GetQ(b0,aQMDP);
                    if(qQMDP>valMax)
                    {
                        valMax=qQMDP;
                        a=aQMDP;
                    }
                }
            }
            else
            {
                // sample an action uniformly at random
                a=static_cast<int>(nrA*(rand() / (RAND_MAX + 1.0)));
            }

            s1=GetPU()->GetDPOMDPD()->SampleSuccessorState(s0,a);
            if(GetPU()->GetParams().GetEventObservability())
            {
                o=GetPU()->GetDPOMDPD()->SampleJointObservation(s0,a,s1);
            }
            else
            {
                o=GetPU()->GetDPOMDPD()->SampleJointObservation(a,s1);
            }
            b1=b0;
            b1.Update(*GetPU()->GetDPOMDPD(),a,o);
        }

        if(args.uniqueBeliefs)
        {
            foundEqualBelief=false;
            // loop over all beliefs already in S
            for(int j=0;j!=i;j++)
            {
                equal=true;
                for(s=0;s!=nrS;s++)
                {
                    // if one number differs we can move on to the next j
                    if(S[j]->Get(s)!=b1.Get(s))
                    {
                        equal=false;
                        break;
                    }
                }
                // if we found an equal belief we can stop
                if(equal)
                {
                    foundEqualBelief=true;
                    break;
                }
            }
            if(foundEqualBelief)
            {
                nrEqualFound++;
                addBelief=false;
            }
            else
                addBelief=true;
        }
        else
            addBelief=true;
        
        if(addBelief)
        {
            if(!b1.SanityCheck())
                throw(E("AlphaVectorPlanning::BeliefSampling belief fails sanity check"));

            S[i]=b1.Clone();
            i++;

            if(DEBUG_AlphaVectorPlanning_BeliefSampling)
            {
                cout << "AlphaVectorPlanning::SampleBeliefs sampled belief nr "
                     << i << "/" << args.nrBeliefs << " (nrEqualFound " 
                     << nrEqualFound << ")" << endl;
            }
        }
        
        d++;
        s0=s1;
        b0=b1;
    }

    delete b0p;
    delete b1p;
    delete qmdp;

    StopTimer("SampleBeliefs");

    // we did not manage to sample args.nrBeliefs unique beliefs
    if(i<args.nrBeliefs)
    {
        cout << "AlphaVectorPlanning::SampleBeliefs: warning, only " 
             << "managed to sample " << i << " unique beliefs instead of " 
             << args.nrBeliefs << endl;
        BeliefSet S1(i);
        for(int j=0;j!=i;j++)
            S1[j]=S[j];
        return(S1);
    }
    else
        return(S);
}